

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

adaptive_huffman_data_model * __thiscall
crnlib::adaptive_huffman_data_model::operator=
          (adaptive_huffman_data_model *this,adaptive_huffman_data_model *rhs)

{
  decoder_tables *p;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  decoder_tables *pdVar4;
  
  if (this != rhs) {
    uVar1 = rhs->m_update_cycle;
    uVar2 = rhs->m_symbols_until_update;
    uVar3 = rhs->m_total_count;
    this->m_total_syms = rhs->m_total_syms;
    this->m_update_cycle = uVar1;
    this->m_symbols_until_update = uVar2;
    this->m_total_count = uVar3;
    vector<unsigned_short>::operator=(&this->m_sym_freq,&rhs->m_sym_freq);
    vector<unsigned_short>::operator=(&this->m_codes,&rhs->m_codes);
    vector<unsigned_char>::operator=(&this->m_code_sizes,&rhs->m_code_sizes);
    pdVar4 = rhs->m_pDecode_tables;
    p = this->m_pDecode_tables;
    if (pdVar4 == (decoder_tables *)0x0) {
      crnlib_delete<crnlib::prefix_coding::decoder_tables>(p);
      this->m_pDecode_tables = (decoder_tables *)0x0;
    }
    else if (p == (decoder_tables *)0x0) {
      pdVar4 = crnlib_new<crnlib::prefix_coding::decoder_tables,crnlib::prefix_coding::decoder_tables>
                         ((crnlib *)pdVar4,pdVar4);
      this->m_pDecode_tables = pdVar4;
    }
    else {
      prefix_coding::decoder_tables::operator=(p,pdVar4);
    }
    this->m_decoder_table_bits = rhs->m_decoder_table_bits;
    this->m_encoding = rhs->m_encoding;
  }
  return this;
}

Assistant:

adaptive_huffman_data_model& adaptive_huffman_data_model::operator=(const adaptive_huffman_data_model& rhs)
    {
        if (this == &rhs)
        {
            return *this;
        }

        m_total_syms = rhs.m_total_syms;

        m_update_cycle = rhs.m_update_cycle;
        m_symbols_until_update = rhs.m_symbols_until_update;

        m_total_count = rhs.m_total_count;

        m_sym_freq = rhs.m_sym_freq;

        m_codes = rhs.m_codes;
        m_code_sizes = rhs.m_code_sizes;

        if (rhs.m_pDecode_tables)
        {
            if (m_pDecode_tables)
            {
                *m_pDecode_tables = *rhs.m_pDecode_tables;
            }
            else
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
            }
        }
        else
        {
            crnlib_delete(m_pDecode_tables);
            m_pDecode_tables = nullptr;
        }

        m_decoder_table_bits = rhs.m_decoder_table_bits;
        m_encoding = rhs.m_encoding;

        return *this;
    }